

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::PathBezierCurveTo(ImDrawList *this,ImVec2 *p2,ImVec2 *p3,ImVec2 *p4,int num_segments)

{
  value_type *pvVar1;
  ImVec2 local_5c;
  float local_54;
  float local_50;
  float w4;
  float w3;
  float w2;
  float w1;
  float u;
  float t;
  int i_step;
  float t_step;
  ImVec2 p1;
  int num_segments_local;
  ImVec2 *p4_local;
  ImVec2 *p3_local;
  ImVec2 *p2_local;
  ImDrawList *this_local;
  
  p1.x = (float)num_segments;
  unique0x10000104 = p4;
  pvVar1 = ImVector<ImVec2>::back(&this->_Path);
  _i_step = *pvVar1;
  if (p1.x == 0.0) {
    PathBezierToCasteljau
              (&this->_Path,(float)i_step,t_step,p2->x,p2->y,p3->x,p3->y,stack0xffffffffffffffd8->x,
               stack0xffffffffffffffd8->y,this->_Data->CurveTessellationTol,0);
  }
  else {
    t = 1.0 / (float)(int)p1.x;
    for (u = 1.4013e-45; (int)u <= (int)p1.x; u = (float)((int)u + 1)) {
      w1 = t * (float)(int)u;
      w2 = 1.0 - w1;
      w3 = w2 * w2 * w2;
      w4 = w2 * 3.0 * w2 * w1;
      local_50 = w2 * 3.0 * w1 * w1;
      local_54 = w1 * w1 * w1;
      ImVec2::ImVec2(&local_5c,
                     local_54 * stack0xffffffffffffffd8->x +
                     local_50 * p3->x + w3 * (float)i_step + w4 * p2->x,
                     local_54 * stack0xffffffffffffffd8->y +
                     local_50 * p3->y + w3 * t_step + w4 * p2->y);
      ImVector<ImVec2>::push_back(&this->_Path,&local_5c);
    }
  }
  return;
}

Assistant:

void ImDrawList::PathBezierCurveTo(const ImVec2& p2, const ImVec2& p3, const ImVec2& p4, int num_segments)
{
    ImVec2 p1 = _Path.back();
    if (num_segments == 0)
    {
        // Auto-tessellated
        PathBezierToCasteljau(&_Path, p1.x, p1.y, p2.x, p2.y, p3.x, p3.y, p4.x, p4.y, _Data->CurveTessellationTol, 0);
    }
    else
    {
        float t_step = 1.0f / (float)num_segments;
        for (int i_step = 1; i_step <= num_segments; i_step++)
        {
            float t = t_step * i_step;
            float u = 1.0f - t;
            float w1 = u*u*u;
            float w2 = 3*u*u*t;
            float w3 = 3*u*t*t;
            float w4 = t*t*t;
            _Path.push_back(ImVec2(w1*p1.x + w2*p2.x + w3*p3.x + w4*p4.x, w1*p1.y + w2*p2.y + w3*p3.y + w4*p4.y));
        }
    }
}